

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int attach_set_max_message_size(ATTACH_HANDLE attach,uint64_t max_message_size_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  ATTACH_INSTANCE *attach_instance;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x134c;
  }
  else {
    item_value = amqpvalue_create_ulong(max_message_size_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1354;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,10,item_value);
      iVar2 = 0x135a;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int attach_set_max_message_size(ATTACH_HANDLE attach, uint64_t max_message_size_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE max_message_size_amqp_value = amqpvalue_create_ulong(max_message_size_value);
        if (max_message_size_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 10, max_message_size_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(max_message_size_amqp_value);
        }
    }

    return result;
}